

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O3

void ngx_http_upstream_send_request
               (ngx_http_request_t *r,ngx_http_upstream_t *u,ngx_uint_t do_write)

{
  ushort uVar1;
  ngx_http_upstream_state_t *pnVar2;
  ngx_log_t *pnVar3;
  ngx_http_request_body_t *pnVar4;
  ngx_pool_t *pnVar5;
  ngx_event_t *pnVar6;
  int iVar7;
  ngx_int_t nVar8;
  long rc;
  int *piVar9;
  uint uVar10;
  ngx_chain_t *pnVar11;
  ngx_chain_t *pnVar12;
  ngx_chain_t *pnVar13;
  ngx_chain_t *pnVar14;
  ngx_connection_t *pnVar15;
  bool bVar16;
  undefined4 local_3c;
  ngx_connection_t *local_38;
  
  pnVar15 = (u->peer).connection;
  if ((pnVar15->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar15->log,0,"http upstream send request");
  }
  pnVar2 = u->state;
  if (pnVar2->connect_time == 0xffffffffffffffff) {
    pnVar2->connect_time = ngx_current_msec - pnVar2->response_time;
  }
  if (((u->field_0x3e9 & 4) == 0) && (nVar8 = ngx_http_upstream_test_connect(pnVar15), nVar8 != 0))
  {
    ngx_http_upstream_next(r,u,2);
    return;
  }
  pnVar15->log->action = "sending request to upstream";
  pnVar3 = r->connection->log;
  if ((pnVar3->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar3,0,"http upstream send request body");
  }
  uVar1 = *(ushort *)&u->field_0x3e8;
  if ((r->field_0x467 & 4) == 0) {
    if ((uVar1 >> 10 & 1) == 0) {
      *(ushort *)&u->field_0x3e8 = uVar1 | 0x400;
      pnVar13 = u->request_bufs;
    }
    else {
      pnVar13 = (ngx_chain_t *)0x0;
    }
    rc = ngx_output_chain(&u->output,pnVar13);
    if (rc == -1) {
LAB_00152ea3:
      ngx_http_upstream_next(r,u,2);
      return;
    }
  }
  else {
    local_38 = pnVar15;
    if ((uVar1 >> 10 & 1) == 0) {
      *(ushort *)&u->field_0x3e8 = uVar1 | 0x400;
      pnVar13 = u->request_bufs;
      pnVar4 = r->request_body;
      pnVar12 = pnVar4->bufs;
      if (pnVar12 != (ngx_chain_t *)0x0) {
        pnVar14 = pnVar13->next;
        pnVar11 = pnVar13;
        if ((pnVar14 != (ngx_chain_t *)0x0) &&
           (pnVar11 = pnVar14, pnVar14->next != (ngx_chain_t *)0x0)) {
          do {
          } while( true );
        }
        pnVar11->next = pnVar12;
        pnVar4->bufs = (ngx_chain_t *)0x0;
      }
      if ((*(long *)((long)r->loc_conf[ngx_http_core_module.ctx_index] + 0x1a8) != 0) &&
         (pnVar15 = (u->peer).connection, (pnVar15->field_0xda & 0x30) == 0)) {
        if ((pnVar15->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar15->log,0,"tcp_nodelay");
        }
        local_3c = 1;
        iVar7 = setsockopt(pnVar15->fd,6,1,&local_3c,4);
        if (iVar7 == -1) {
          piVar9 = __errno_location();
          ngx_connection_error(pnVar15,*piVar9,"setsockopt(TCP_NODELAY) failed");
          goto LAB_00152ea3;
        }
        *(uint *)&pnVar15->field_0xd8 = *(uint *)&pnVar15->field_0xd8 & 0xffcfffff | 0x100000;
      }
      r->read_event_handler = ngx_http_upstream_read_request_handler;
    }
    else {
      pnVar13 = (ngx_chain_t *)0x0;
    }
    bVar16 = do_write == 0;
    do {
      if (bVar16) {
        uVar10 = (uint)*(undefined8 *)&r->field_0x468;
      }
      else {
        nVar8 = ngx_output_chain(&u->output,pnVar13);
        if (nVar8 == -1) goto LAB_00152ea3;
        if (pnVar13 != (ngx_chain_t *)0x0) {
          pnVar5 = r->pool;
          pnVar12 = pnVar5->chain;
          do {
            pnVar14 = pnVar13;
            pnVar13 = pnVar14->next;
            pnVar14->next = pnVar12;
            pnVar12 = pnVar14;
          } while (pnVar13 != (ngx_chain_t *)0x0);
          pnVar5->chain = pnVar14;
        }
        uVar10 = (uint)*(ulong *)&r->field_0x468;
        rc = 0;
        if (nVar8 == 0 && (*(ulong *)&r->field_0x468 & 0x2000) == 0) goto LAB_00153018;
        pnVar13 = (ngx_chain_t *)0x0;
      }
      if ((uVar10 & 0x2000) != 0) {
        rc = ngx_http_read_unbuffered_request_body(r);
        pnVar15 = local_38;
        if (299 < rc) goto LAB_00153059;
        pnVar13 = r->request_body->bufs;
        r->request_body->bufs = (ngx_chain_t *)0x0;
      }
      bVar16 = false;
    } while (pnVar13 != (ngx_chain_t *)0x0);
    uVar10 = (uint)*(undefined8 *)&r->field_0x468;
    rc = -2;
LAB_00153018:
    pnVar15 = local_38;
    if (((((uVar10 >> 0xd & 1) == 0) && ((uVar10 >> 0x11 & 1) == 0)) &&
        ((*(ushort *)&u->field_0x3e8 & 1) == 0)) && (u->conf->ignore_client_abort == 0)) {
      r->read_event_handler = ngx_http_upstream_rd_check_broken_connection;
    }
  }
LAB_00153059:
  if (299 < rc) goto LAB_001531f1;
  if (rc == -2) {
    pnVar6 = pnVar15->write;
    if ((*(uint *)&pnVar6->field_0x8 & 0x20) == 0) {
      ngx_event_add_timer(pnVar6,u->conf->send_timeout);
    }
    else if ((*(uint *)&pnVar6->field_0x8 >> 0xb & 1) != 0) {
      if ((pnVar6->log->log_level & 0x80) != 0) {
        ngx_log_error_core(8,pnVar6->log,0,"event timer del: %d: %M",
                           (ulong)*(uint *)((long)pnVar6->data + 0x18),(pnVar6->timer).key);
      }
      ngx_rbtree_delete(&ngx_event_timer_rbtree,&pnVar6->timer);
      (pnVar6->timer).left = (ngx_rbtree_node_t *)0x0;
      (pnVar6->timer).right = (ngx_rbtree_node_t *)0x0;
      (pnVar6->timer).parent = (ngx_rbtree_node_t *)0x0;
      pnVar6->field_0x9 = pnVar6->field_0x9 & 0xf7;
    }
    nVar8 = ngx_handle_write_event(pnVar15->write,u->conf->send_lowat);
    if (nVar8 == 0) {
      return;
    }
  }
  else {
    u->field_0x3e9 = u->field_0x3e9 | 8;
    pnVar6 = pnVar15->write;
    if ((pnVar6->field_0x9 & 8) != 0) {
      if ((pnVar6->log->log_level & 0x80) != 0) {
        ngx_log_error_core(8,pnVar6->log,0,"event timer del: %d: %M",
                           (ulong)*(uint *)((long)pnVar6->data + 0x18),(pnVar6->timer).key);
      }
      ngx_rbtree_delete(&ngx_event_timer_rbtree,&pnVar6->timer);
      (pnVar6->timer).left = (ngx_rbtree_node_t *)0x0;
      (pnVar6->timer).right = (ngx_rbtree_node_t *)0x0;
      (pnVar6->timer).parent = (ngx_rbtree_node_t *)0x0;
      pnVar6->field_0x9 = pnVar6->field_0x9 & 0xf7;
    }
    if ((*(uint *)&pnVar15->field_0xd8 & 0xc00000) == 0x400000) {
      iVar7 = ngx_tcp_push(pnVar15->fd);
      if (iVar7 == -1) {
        pnVar3 = pnVar15->log;
        if (2 < pnVar3->log_level) {
          piVar9 = __errno_location();
          ngx_log_error_core(3,pnVar3,*piVar9,"setsockopt(!TCP_CORK) failed");
        }
        goto LAB_001531e6;
      }
      pnVar15->field_0xda = pnVar15->field_0xda & 0x3f;
    }
    u->write_event_handler = ngx_http_upstream_dummy_handler;
    nVar8 = ngx_handle_write_event(pnVar15->write,0);
    if (nVar8 == 0) {
      ngx_event_add_timer(pnVar15->read,u->conf->read_timeout);
      if ((pnVar15->read->field_0x8 & 0x20) == 0) {
        return;
      }
      ngx_http_upstream_process_header(r,u);
      return;
    }
  }
LAB_001531e6:
  rc = 500;
LAB_001531f1:
  ngx_http_upstream_finalize_request(r,u,rc);
  return;
}

Assistant:

static void
ngx_http_upstream_send_request(ngx_http_request_t *r, ngx_http_upstream_t *u,
    ngx_uint_t do_write)
{
    ngx_int_t          rc;
    ngx_connection_t  *c;

    c = u->peer.connection;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http upstream send request");

    if (u->state->connect_time == (ngx_msec_t) -1) {
        u->state->connect_time = ngx_current_msec - u->state->response_time;
    }

    if (!u->request_sent && ngx_http_upstream_test_connect(c) != NGX_OK) {
        ngx_http_upstream_next(r, u, NGX_HTTP_UPSTREAM_FT_ERROR);
        return;
    }

    c->log->action = "sending request to upstream";

    rc = ngx_http_upstream_send_request_body(r, u, do_write);

    if (rc == NGX_ERROR) {
        ngx_http_upstream_next(r, u, NGX_HTTP_UPSTREAM_FT_ERROR);
        return;
    }

    if (rc >= NGX_HTTP_SPECIAL_RESPONSE) {
        ngx_http_upstream_finalize_request(r, u, rc);
        return;
    }

    if (rc == NGX_AGAIN) {
        if (!c->write->ready) {
            ngx_add_timer(c->write, u->conf->send_timeout);

        } else if (c->write->timer_set) {
            ngx_del_timer(c->write);
        }

        if (ngx_handle_write_event(c->write, u->conf->send_lowat) != NGX_OK) {
            ngx_http_upstream_finalize_request(r, u,
                                               NGX_HTTP_INTERNAL_SERVER_ERROR);
            return;
        }

        return;
    }

    /* rc == NGX_OK */

    u->request_body_sent = 1;

    if (c->write->timer_set) {
        ngx_del_timer(c->write);
    }

    if (c->tcp_nopush == NGX_TCP_NOPUSH_SET) {
        if (ngx_tcp_push(c->fd) == NGX_ERROR) {
            ngx_log_error(NGX_LOG_CRIT, c->log, ngx_socket_errno,
                          ngx_tcp_push_n " failed");
            ngx_http_upstream_finalize_request(r, u,
                                               NGX_HTTP_INTERNAL_SERVER_ERROR);
            return;
        }

        c->tcp_nopush = NGX_TCP_NOPUSH_UNSET;
    }

    u->write_event_handler = ngx_http_upstream_dummy_handler;

    if (ngx_handle_write_event(c->write, 0) != NGX_OK) {
        ngx_http_upstream_finalize_request(r, u,
                                           NGX_HTTP_INTERNAL_SERVER_ERROR);
        return;
    }

    ngx_add_timer(c->read, u->conf->read_timeout);

    if (c->read->ready) {
        ngx_http_upstream_process_header(r, u);
        return;
    }
}